

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O2

bool google::protobuf::internal::InitializeEnumStrings
               (EnumEntry *enums,int *sorted_indices,size_t size,
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *enum_strings)

{
  int i;
  size_t sVar1;
  
  for (sVar1 = 0; size != sVar1; sVar1 = sVar1 + 1) {
    StringPiece::ToString_abi_cxx11_((string *)enum_strings,&enums[sorted_indices[sVar1]].name);
    OnShutdownDestroyString((string *)enum_strings);
    enum_strings = (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((string *)enum_strings + 1);
  }
  return true;
}

Assistant:

bool InitializeEnumStrings(
    const EnumEntry* enums, const int* sorted_indices, size_t size,
    internal::ExplicitlyConstructed<std::string>* enum_strings) {
  for (int i = 0; i < size; ++i) {
    enum_strings[i].Construct(enums[sorted_indices[i]].name);
    internal::OnShutdownDestroyString(enum_strings[i].get_mutable());
  }
  return true;
}